

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

_Unwind_Reason_Code __thiscall
backward::details::Unwinder<backward::StackTraceImpl<backward::system_tag::linux_tag>::callback>::
backtrace(Unwinder<backward::StackTraceImpl<backward::system_tag::linux_tag>::callback> *this,
         _Unwind_Context *ctx)

{
  size_t idx;
  undefined8 in_RSI;
  void *in_RDI;
  uintptr_t ip;
  int ip_before_instruction;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  _Unwind_Reason_Code local_4;
  
  if ((*(long *)((long)in_RDI + 8) < 0) ||
     (*(ulong *)((long)in_RDI + 8) < *(ulong *)((long)in_RDI + 0x10))) {
    iVar1 = 0;
    idx = _Unwind_GetIPInfo(in_RSI,&stack0xffffffffffffffe4);
    if (iVar1 == 0) {
      if (idx == 0) {
        idx = std::numeric_limits<unsigned_long>::max();
      }
      else {
        idx = idx - 1;
      }
    }
    if (-1 < *(long *)((long)in_RDI + 8)) {
      StackTraceImpl<backward::system_tag::linux_tag>::callback::operator()
                ((callback *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),idx,in_RDI);
    }
    *(long *)((long)in_RDI + 8) = *(long *)((long)in_RDI + 8) + 1;
    local_4 = _URC_NO_REASON;
  }
  else {
    local_4 = _URC_END_OF_STACK;
  }
  return local_4;
}

Assistant:

_Unwind_Reason_Code backtrace(_Unwind_Context *ctx) {
    if (_index >= 0 && static_cast<size_t>(_index) >= _depth)
      return _URC_END_OF_STACK;

    int ip_before_instruction = 0;
    uintptr_t ip = _Unwind_GetIPInfo(ctx, &ip_before_instruction);

    if (!ip_before_instruction) {
      // calculating 0-1 for unsigned, looks like a possible bug to sanitiziers,
      // so let's do it explicitly:
      if (ip == 0) {
        ip = std::numeric_limits<uintptr_t>::max(); // set it to 0xffff... (as
                                                    // from casting 0-1)
      } else {
        ip -= 1; // else just normally decrement it (no overflow/underflow will
                 // happen)
      }
    }

    if (_index >= 0) { // ignore first frame.
      (*_f)(static_cast<size_t>(_index), reinterpret_cast<void *>(ip));
    }
    _index += 1;
    return _URC_NO_REASON;
  }